

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crashcatcher.c
# Opt level: O1

void crash_catcher(int signum,siginfo_t *siginfo,void *context)

{
  __uid_t _Var1;
  __uid_t _Var2;
  int iVar3;
  uint __pid;
  uint uVar4;
  long lVar5;
  size_t len;
  char *buf;
  siginfo_t *psVar6;
  byte bVar7;
  int fd [2];
  int status;
  int local_24;
  int local_20;
  uint local_1c;
  
  bVar7 = 0;
  _Var1 = getuid();
  _Var2 = geteuid();
  if (_Var1 != _Var2) {
    raise(signum);
    return;
  }
  safe_write(2,"\n\n*** Fatal Error ***\n",0x16);
  iVar3 = pipe(&local_24);
  if (iVar3 == -1) {
    buf = "!!! Failed to create pipe\n";
    len = 0x1a;
  }
  else {
    crash_info.signum = signum;
    crash_info.pid = getpid();
    crash_info.has_siginfo = (int)(siginfo != (siginfo_t *)0x0);
    if (siginfo != (siginfo_t *)0x0) {
      psVar6 = &crash_info.siginfo;
      for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
        iVar3 = siginfo->si_errno;
        psVar6->si_signo = siginfo->si_signo;
        psVar6->si_errno = iVar3;
        siginfo = (siginfo_t *)((long)siginfo + (ulong)bVar7 * -0x10 + 8);
        psVar6 = (siginfo_t *)((long)psVar6 + ((ulong)bVar7 * -2 + 1) * 8);
      }
    }
    if (cc_user_info != (_func_int_char_ptr_char_ptr *)0x0) {
      (*cc_user_info)(crash_info.buf,(char *)&Video);
    }
    __pid = fork();
    if (__pid != 0xffffffff) {
      if (__pid == 0) {
        dup2(local_24,0);
        close(local_24);
        close(local_20);
        execl(argv0,argv0,"--cc-handle-crash",0);
        safe_write(2,"!!! Failed to exec debug process\n",0x21);
        _exit(1);
      }
      prctl(0x59616d61,(ulong)__pid,0,0,0);
      safe_write(local_20,&crash_info,0x1090);
      close(local_24);
      close(local_20);
      do {
        do {
          uVar4 = waitpid(__pid,(int *)&local_1c,0);
        } while (uVar4 != __pid);
      } while (((local_1c & 0x7f) != 0) &&
              ((int)((local_1c & 0x7f) * 0x1000000 + 0x1000000) < 0x2000000));
      goto LAB_002c8451;
    }
    buf = "!!! Failed to fork debug process\n";
    len = 0x21;
  }
  safe_write(2,buf,len);
LAB_002c8451:
  raise(signum);
  return;
}

Assistant:

static void crash_catcher(int signum, siginfo_t *siginfo, void *context)
{
	//ucontext_t *ucontext = (ucontext_t*)context;
	pid_t dbg_pid;
	int fd[2];

	/* Make sure the effective uid is the real uid */
	if(getuid() != geteuid())
	{
		raise(signum);
		return;
	}

	safe_write(STDERR_FILENO, fatal_err, sizeof(fatal_err)-1);
	if(pipe(fd) == -1)
	{
		safe_write(STDERR_FILENO, pipe_err, sizeof(pipe_err)-1);
		raise(signum);
		return;
	}

	crash_info.signum = signum;
	crash_info.pid = getpid();
	crash_info.has_siginfo = !!siginfo;
	if(siginfo)
		crash_info.siginfo = *siginfo;
	if(cc_user_info)
		cc_user_info(crash_info.buf, crash_info.buf+sizeof(crash_info.buf));

	/* Fork off to start a crash handler */
	switch((dbg_pid=fork()))
	{
		/* Error */
		case -1:
			safe_write(STDERR_FILENO, fork_err, sizeof(fork_err)-1);
			raise(signum);
			return;

		case 0:
			dup2(fd[0], STDIN_FILENO);
			close(fd[0]);
			close(fd[1]);

			execl(argv0, argv0, crash_switch, NULL);

			safe_write(STDERR_FILENO, exec_err, sizeof(exec_err)-1);
			_exit(1);

		default:
#ifdef __linux__
			prctl(PR_SET_PTRACER, dbg_pid, 0, 0, 0);
#endif
			safe_write(fd[1], &crash_info, sizeof(crash_info));
			close(fd[0]);
			close(fd[1]);

			/* Wait; we'll be killed when gdb is done */
			do {
				int status;
				if(waitpid(dbg_pid, &status, 0) == dbg_pid &&
				   (WIFEXITED(status) || WIFSIGNALED(status)))
				{
					/* The debug process died before it could kill us */
					raise(signum);
					break;
				}
			} while(1);
	}
}